

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O2

int cbs_get_length_prefixed(CBS *cbs,CBS *out,size_t len_len)

{
  uint8_t *puVar1;
  int iVar2;
  int iVar3;
  uint64_t in_RAX;
  uint64_t len;
  
  len = in_RAX;
  iVar2 = cbs_get_u(cbs,&len,len_len);
  iVar3 = 0;
  if (iVar2 != 0) {
    if (len <= cbs->len) {
      puVar1 = cbs->data;
      cbs->data = puVar1 + len;
      cbs->len = cbs->len - len;
      out->data = puVar1;
      out->len = len;
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

static int cbs_get_length_prefixed(CBS *cbs, CBS *out, size_t len_len) {
  uint64_t len;
  if (!cbs_get_u(cbs, &len, len_len)) {
    return 0;
  }
  // If |len_len| <= 3 then we know that |len| will fit into a |size_t|, even on
  // 32-bit systems.
  assert(len_len <= 3);
  return CBS_get_bytes(cbs, out, len);
}